

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O1

void findOptimalFlags(char **FLAG,int height,int width,int *imax,int *jmax)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  
  if (((jmax != (int *)0x0 && (imax != (int *)0x0 && FLAG != (char **)0x0)) &&
      (width != 0 && height != 0)) &&
     (pvVar5 = malloc((long)(short)height * 2), pvVar5 != (void *)0x0)) {
    if (0 < height) {
      memset(pvVar5,0,(ulong)(uint)(height * 2));
    }
    if (0 < width) {
      uVar6 = 0;
      do {
        if (1 < height) {
          pcVar2 = FLAG[uVar6];
          cVar10 = *pcVar2;
          uVar8 = 1;
          do {
            cVar1 = pcVar2[uVar8];
            if (cVar10 != cVar1) {
              *(undefined2 *)((long)pvVar5 + uVar8 * 2) = 1;
              cVar10 = cVar1;
            }
            uVar8 = uVar8 + 1;
          } while ((uint)height != uVar8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)width);
    }
    iVar7 = 0;
    iVar3 = height;
    do {
      uVar11 = height - iVar7;
      iVar4 = iVar3;
      if (uVar11 == 0 || height < iVar7) break;
      uVar6 = 1;
      iVar4 = iVar7 + 1;
      if (iVar7 + 1 < height) {
        uVar8 = 1;
        do {
          if (*(short *)((long)pvVar5 + (ulong)(uint)(iVar7 + (int)uVar8) * 2) != 0) {
            uVar6 = uVar8;
            iVar4 = iVar7 + (int)uVar8;
            break;
          }
          uVar8 = uVar8 + 1;
          uVar6 = (ulong)uVar11;
          iVar4 = height;
        } while (uVar11 != uVar8);
      }
      iVar7 = iVar4;
      if ((int)uVar6 < iVar3) {
        iVar3 = (int)uVar6;
      }
      iVar4 = 1;
    } while (iVar3 != 1);
    free(pvVar5);
    iVar4 = (height * 2) / iVar4;
    iVar3 = *jmax;
    if (*jmax < iVar4) {
      iVar3 = iVar4;
    }
    pvVar5 = malloc((long)(short)width * 2);
    if (pvVar5 != (void *)0x0) {
      if (0 < width) {
        memset(pvVar5,0,(ulong)(uint)(width * 2));
      }
      if (0 < height) {
        uVar6 = 0;
        do {
          if (1 < width) {
            uVar8 = 1;
            do {
              if (FLAG[uVar8][uVar6] != FLAG[uVar8 - 1][uVar6]) {
                *(undefined2 *)((long)pvVar5 + uVar8 * 2) = 1;
              }
              uVar8 = uVar8 + 1;
            } while ((uint)width != uVar8);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)height);
      }
      iVar7 = 0;
      uVar6 = (ulong)(uint)width;
      do {
        uVar11 = width - iVar7;
        iVar4 = (int)uVar6;
        if (uVar11 == 0 || width < iVar7) break;
        uVar8 = 1;
        iVar4 = iVar7 + 1;
        if (iVar7 + 1 < width) {
          uVar9 = 1;
          do {
            if (*(short *)((long)pvVar5 + (ulong)(uint)(iVar7 + (int)uVar9) * 2) != 0) {
              uVar8 = uVar9;
              iVar4 = iVar7 + (int)uVar9;
              break;
            }
            uVar9 = uVar9 + 1;
            uVar8 = (ulong)uVar11;
            iVar4 = width;
          } while (uVar11 != uVar9);
        }
        iVar7 = iVar4;
        if ((int)uVar8 < (int)uVar6) {
          uVar6 = uVar8 & 0xffffffff;
        }
        iVar4 = 1;
      } while ((int)uVar6 != 1);
      free(pvVar5);
      iVar4 = (width * 2) / iVar4;
      iVar7 = *imax;
      if (*imax < iVar4) {
        iVar7 = iVar4;
      }
      *jmax = iVar3;
      *imax = iVar7;
    }
  }
  return;
}

Assistant:

void findOptimalFlags (char **FLAG, int height, int width, int *imax, int *jmax)
{
	if (!FLAG || !imax || !jmax)
		return;
	if (!height || !width)
		return;
	/* Find the structure size in y-direction */
	int blockType, blockSize = height;
	int newHeight, newWidth;
	int i, j;
	short *structureVec = malloc(((short)height)*sizeof(short));
	if (structureVec == NULL)
		return;
	for (j = 0; j < height; j++)
		structureVec[j] = 0;
	for (i = 0; i < width; i++)
	{
		blockType = FLAG[i][0];
		for (j = 1; j < height; j++)
		{
			if (FLAG[i][j] != blockType)
			{
				structureVec[j] = 1;
				blockType = FLAG[i][j];
			}
		}
	}
	for (j = 0; j < height; j+=i)
	{
		i = 1;
		while (j+i < height && structureVec[j+i] == 0)
		{
			i++;
		}
		if (i < blockSize)
			blockSize = i;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the height necessary to represent the image, but no less than *jmax */
	newHeight = (height * 2)/blockSize;
	if (newHeight < *jmax)
		newHeight = *jmax;
	/* Now do exactly the same thing for the x-direction */
	blockSize = width;
	structureVec = malloc((short)width*sizeof(short));
	if (structureVec == NULL)
		return;
	for (i = 0; i < width; i++)
		structureVec[i] = 0;
	for (j = 0; j < height; j++)
	{
		blockType = FLAG[0][j];
		for (i = 1; i < width; i++)
		{
			if (FLAG[i][j] != blockType)
				structureVec[i] = 1;
			blockType = FLAG[i][j];
		}
	}
	for (i = 0; i < width; i+=j)
	{
		j = 1;
		while (j+i < width && structureVec[j+i] == 0)
		{
			j++;
		}
		if (j < blockSize)
			blockSize = j;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the width necessary to represent the image, but no less than *imax */
	newWidth = (width * 2)/blockSize;
	if (newWidth < *imax)
		newWidth = *imax;
	*jmax = newHeight;
	*imax = newWidth;
	return;
}